

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::QueryGeometrySeparate::checkTransformFeedbackBuffer
          (QueryGeometrySeparate *this,BindBufferCase bind_case,GLenum primitive_type)

{
  long *plVar1;
  deUint32 err;
  long lVar2;
  undefined4 in_register_00000034;
  GLuint number_of_primitives;
  int local_1c;
  
  plVar1 = *(long **)(*(long *)(&(this->super_CaptureGeometrySeparate).
                                 super_CaptureGeometryInterleaved.field_0x78 +
                               (long)(this->super_CaptureGeometrySeparate).
                                     super_CaptureGeometryInterleaved.
                                     _vptr_CaptureGeometryInterleaved[-3]) + 8);
  lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1,CONCAT44(in_register_00000034,bind_case));
  (**(code **)(lVar2 + 0xa20))
            (*(undefined4 *)
              &(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.field_0x14,
             0x8866,&local_1c);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"glGetQueryObjectuiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x100c);
  return (uint)(primitive_type == 0) * 2 + 1 == local_1c;
}

Assistant:

bool gl3cts::TransformFeedback::QueryGeometrySeparate::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint number_of_primitives;

	gl.getQueryObjectuiv(m_query_object, GL_QUERY_RESULT, &number_of_primitives);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv call failed.");

	/* expected result */
	glw::GLuint number_of_primitives_reference = (primitive_type == GL_POINTS) ? 3 : 1; /* m_max_vertices_drawn == 3 */

	if (number_of_primitives_reference != number_of_primitives)
	{
		return false;
	}

	return true;
}